

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_game.cpp
# Opt level: O2

bool __thiscall FCajunMaster::LoadBots(FCajunMaster *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  botinfo_t *pbVar6;
  char *pcVar7;
  uint i;
  ulong uVar8;
  char **front;
  long lVar9;
  uint local_154;
  FString tmp;
  char teamstr [16];
  FScanner sc;
  
  FScanner::FScanner(&sc);
  tmp.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  ForgetBots(&bglobal);
  M_GetCajunPath(teamstr);
  FString::operator=(&tmp,(FString *)teamstr);
  FString::~FString((FString *)teamstr);
  if (*(int *)(tmp.Chars + -0xc) == 0) {
    bVar3 = false;
    DPrintf(1,"No bots.cfg, so no bots\n");
  }
  else {
    FScanner::OpenFile(&sc,tmp.Chars);
    bVar3 = false;
    local_154 = 0;
    while (bVar1 = FScanner::GetString(&sc), bVar1) {
      bVar1 = FScanner::Compare(&sc,"{");
      if (!bVar1) {
        FScanner::ScriptError(&sc,"Unexpected token \'%s\'\n",sc.String);
      }
      pbVar6 = (botinfo_t *)operator_new(0x30);
      (pbVar6->skill).reaction = 0;
      (pbVar6->skill).isp = 0;
      pbVar6->inuse = 0;
      pbVar6->lastteam = 0;
      pbVar6->info = (char *)0x0;
      (pbVar6->skill).aiming = 0;
      (pbVar6->skill).perfection = 0;
      pbVar6->next = (botinfo_t *)0x0;
      pbVar6->name = (char *)0x0;
      pcVar7 = copystring("\\autoaim\\0\\movebob\\.25");
      front = &pbVar6->info;
      pbVar6->info = pcVar7;
      bVar1 = false;
      while( true ) {
        FScanner::MustGetString(&sc);
        bVar2 = FScanner::Compare(&sc,"}");
        if (bVar2) break;
        iVar4 = FScanner::MatchString(&sc,BotConfigStrings,8);
        pcVar7 = sc.String;
        switch(iVar4) {
        case 0:
          FScanner::MustGetString(&sc);
          appendinfo(front,"name");
          appendinfo(front,sc.String);
          pcVar7 = copystring(sc.String);
          pbVar6->name = pcVar7;
          break;
        case 1:
          FScanner::MustGetNumber(&sc);
          (pbVar6->skill).aiming = sc.Number;
          break;
        case 2:
          FScanner::MustGetNumber(&sc);
          (pbVar6->skill).perfection = sc.Number;
          break;
        case 3:
          FScanner::MustGetNumber(&sc);
          (pbVar6->skill).reaction = sc.Number;
          break;
        case 4:
          FScanner::MustGetNumber(&sc);
          (pbVar6->skill).isp = sc.Number;
          break;
        case 5:
          FScanner::MustGetString(&sc);
          bVar3 = IsNum(sc.String);
          if (bVar3) {
            uVar5 = atoi(sc.String);
            bVar3 = FTeam::IsValidTeam(&TeamLibrary,uVar5 & 0xff);
            if (!bVar3) {
              uVar5 = 0xff;
            }
            uVar8 = (ulong)uVar5;
          }
          else {
            lVar9 = 0;
            for (uVar8 = 0; uVar8 < Teams.Count; uVar8 = uVar8 + 1) {
              pcVar7 = FTeam::GetName((FTeam *)((long)&(Teams.Array)->m_iPlayerCount + lVar9));
              iVar4 = strcasecmp(pcVar7,sc.String);
              if (iVar4 == 0) goto LAB_0041f624;
              lVar9 = lVar9 + 0x38;
            }
            uVar8 = 0xff;
          }
LAB_0041f624:
          appendinfo(front,"team");
          mysnprintf(teamstr,0x10,"%d",uVar8 & 0xff);
          appendinfo(front,teamstr);
          bVar3 = true;
          break;
        default:
          iVar4 = strcasecmp(sc.String,"playerclass");
          appendinfo(front,pcVar7);
          FScanner::MustGetString(&sc);
          bVar1 = (bool)(bVar1 | iVar4 == 0);
          appendinfo(front,sc.String);
        }
      }
      if (!bVar1) {
        appendinfo(front,"playerclass");
        appendinfo(front,"random");
      }
      if (!bVar3) {
        appendinfo(front,"team");
        appendinfo(front,"255");
      }
      pbVar6->next = bglobal.botinfo;
      pbVar6->lastteam = 0xff;
      local_154 = local_154 + 1;
      bglobal.botinfo = pbVar6;
    }
    bVar3 = true;
    Printf("%d bots read from %s\n",(ulong)local_154,"bots.cfg");
  }
  FString::~FString(&tmp);
  FScanner::~FScanner(&sc);
  return bVar3;
}

Assistant:

bool FCajunMaster::LoadBots ()
{
	FScanner sc;
	FString tmp;
	bool gotteam = false;
	int loaded_bots = 0;

	bglobal.ForgetBots ();
	tmp = M_GetCajunPath(BOTFILENAME);
	if (tmp.IsEmpty())
	{
		DPrintf (DMSG_ERROR, "No " BOTFILENAME ", so no bots\n");
		return false;
	}
	try
	{
		sc.OpenFile(tmp);
	}
	catch (CRecoverableError &err)
	{
		Printf("%s. So no bots\n", err.GetMessage());
		return false;
	}

	while (sc.GetString ())
	{
		if (!sc.Compare ("{"))
		{
			sc.ScriptError ("Unexpected token '%s'\n", sc.String);
		}

		botinfo_t *newinfo = new botinfo_t;
		bool gotclass = false;

		memset (newinfo, 0, sizeof(*newinfo));

		newinfo->info = copystring ("\\autoaim\\0\\movebob\\.25");

		for (;;)
		{
			sc.MustGetString ();
			if (sc.Compare ("}"))
				break;

			switch (sc.MatchString (BotConfigStrings))
			{
			case BOTCFG_NAME:
				sc.MustGetString ();
				appendinfo (newinfo->info, "name");
				appendinfo (newinfo->info, sc.String);
				newinfo->name = copystring (sc.String);
				break;

			case BOTCFG_AIMING:
				sc.MustGetNumber ();
				newinfo->skill.aiming = sc.Number;
				break;

			case BOTCFG_PERFECTION:
				sc.MustGetNumber ();
				newinfo->skill.perfection = sc.Number;
				break;

			case BOTCFG_REACTION:
				sc.MustGetNumber ();
				newinfo->skill.reaction = sc.Number;
				break;

			case BOTCFG_ISP:
				sc.MustGetNumber ();
				newinfo->skill.isp = sc.Number;
				break;

			case BOTCFG_TEAM:
				{
					char teamstr[16];
					BYTE teamnum;

					sc.MustGetString ();
					if (IsNum (sc.String))
					{
						teamnum = atoi (sc.String);
						if (!TeamLibrary.IsValidTeam (teamnum))
						{
							teamnum = TEAM_NONE;
						}
					}
					else
					{
						teamnum = TEAM_NONE;
						for (unsigned int i = 0; i < Teams.Size(); ++i)
						{
							if (stricmp (Teams[i].GetName (), sc.String) == 0)
							{
								teamnum = i;
								break;
							}
						}
					}
					appendinfo (newinfo->info, "team");
					mysnprintf (teamstr, countof(teamstr), "%d", teamnum);
					appendinfo (newinfo->info, teamstr);
					gotteam = true;
					break;
				}

			default:
				if (stricmp (sc.String, "playerclass") == 0)
				{
					gotclass = true;
				}
				appendinfo (newinfo->info, sc.String);
				sc.MustGetString ();
				appendinfo (newinfo->info, sc.String);
				break;
			}
		}
		if (!gotclass)
		{ // Bots that don't specify a class get a random one
			appendinfo (newinfo->info, "playerclass");
			appendinfo (newinfo->info, "random");
		}
		if (!gotteam)
		{ // Same for bot teams
			appendinfo (newinfo->info, "team");
			appendinfo (newinfo->info, "255");
		}
		newinfo->next = bglobal.botinfo;
		newinfo->lastteam = TEAM_NONE;
		bglobal.botinfo = newinfo;
		loaded_bots++;
	}
	Printf ("%d bots read from %s\n", loaded_bots, BOTFILENAME);
	return true;
}